

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.h
# Opt level: O0

int bloaty::ReadFixed<int,4ul>(string_view *data)

{
  int iVar1;
  size_type sVar2;
  int *piVar3;
  basic_string_view<char,_std::char_traits<char>_> *in_RDI;
  char *unaff_retaddr;
  int val;
  
  sVar2 = std::basic_string_view<char,_std::char_traits<char>_>::size(in_RDI);
  if (sVar2 < 4) {
    Throw(unaff_retaddr,(int)((ulong)in_RDI >> 0x20));
  }
  piVar3 = (int *)std::basic_string_view<char,_std::char_traits<char>_>::data(in_RDI);
  iVar1 = *piVar3;
  std::basic_string_view<char,_std::char_traits<char>_>::remove_prefix(in_RDI,4);
  return iVar1;
}

Assistant:

T ReadFixed(std::string_view *data) {
  static_assert(N <= sizeof(T), "N too big for this data type");
  T val = 0;
  if (data->size() < N) {
    THROW("premature EOF reading fixed-length data");
  }
  memcpy(&val, data->data(), N);
  data->remove_prefix(N);
  return val;
}